

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_dlclose(ma_context *pContext,ma_handle handle)

{
  ma_handle handle_local;
  ma_context *pContext_local;
  
  dlclose(handle);
  return;
}

Assistant:

MA_API void ma_dlclose(ma_context* pContext, ma_handle handle)
{
#ifdef _WIN32
    FreeLibrary((HMODULE)handle);
#else
    dlclose((void*)handle);
#endif

    (void)pContext;
}